

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (tree_clusterizer<crnlib::vec<2U,_float>_> *this,vec<2U,_float> *vectors,uint *weights,
          uint size,uint max_splits,bool generate_node_index_map,task_pool *pTask_pool)

{
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::VectorInfo> *this_00;
  hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
  *this_01;
  uint *puVar1;
  vector<crnlib::vec<2U,_float>_> *this_02;
  vector<double> *this_03;
  vec<2U,_float> *pvVar2;
  VectorInfo *pVVar3;
  double *pdVar4;
  void *pvVar5;
  elemental_vector *peVar6;
  bool bVar7;
  uint uVar8;
  vq_node *pvVar9;
  ulong uVar10;
  pointer pNVar11;
  executable_task *pObj;
  vq_node *pvVar12;
  undefined4 in_register_00000084;
  ulong uVar13;
  undefined7 in_register_00000089;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  double dVar24;
  float fVar25;
  float fVar26;
  uint end_node;
  vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::split_alternative_node_task_params>
  params;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  node_queue;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  alternative_node_queue;
  uint local_c4;
  tree_clusterizer<crnlib::vec<2U,_float>_> *local_c0;
  uint local_b4;
  ulong local_b0;
  vector<crnlib::vec<2U,_float>_> *local_a8;
  node_vec_type *local_a0;
  elemental_vector local_98;
  elemental_vector *local_88;
  undefined4 local_7c;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  local_78;
  undefined1 local_50 [8];
  pointer local_48;
  
  local_b0 = CONCAT44(in_register_00000084,max_splits);
  local_7c = (undefined4)CONCAT71(in_register_00000089,generate_node_index_map);
  this->m_vectors = vectors;
  this_00 = &this->m_vectorsInfo;
  uVar8 = (this->m_vectorsInfo).m_size;
  if (uVar8 != size) {
    if ((uVar8 <= size) && ((this->m_vectorsInfo).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,size,uVar8 + 1 == size,8,(object_mover)0x0,false);
    }
    (this->m_vectorsInfo).m_size = size;
  }
  this_02 = &this->m_weightedVectors;
  uVar8 = (this->m_weightedVectors).m_size;
  local_88 = (elemental_vector *)this_00;
  if (uVar8 != size) {
    if ((uVar8 <= size) && ((this->m_weightedVectors).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_02,size,uVar8 + 1 == size,8,(object_mover)0x0,false);
    }
    (this->m_weightedVectors).m_size = size;
  }
  this_03 = &this->m_weightedDotProducts;
  uVar8 = (this->m_weightedDotProducts).m_size;
  if (uVar8 != size) {
    if (uVar8 <= size) {
      if ((this->m_weightedDotProducts).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_03,size,uVar8 + 1 == size,8,(object_mover)0x0,false);
        uVar8 = (this->m_weightedDotProducts).m_size;
      }
      memset(this_03->m_p + uVar8,0,(ulong)(size - uVar8) << 3);
    }
    (this->m_weightedDotProducts).m_size = size;
  }
  uVar8 = (this->m_vectorsInfoLeft).m_size;
  local_c0 = (tree_clusterizer<crnlib::vec<2U,_float>_> *)this_03;
  if (uVar8 != size) {
    if ((uVar8 <= size) && ((this->m_vectorsInfoLeft).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoLeft,size,uVar8 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoLeft).m_size = size;
  }
  uVar8 = (this->m_vectorsInfoRight).m_size;
  if (uVar8 != size) {
    if ((uVar8 <= size) && ((this->m_vectorsInfoRight).m_capacity < size)) {
      elemental_vector::increase_capacity
                ((elemental_vector *)&this->m_vectorsInfoRight,size,uVar8 + 1 == size,8,
                 (object_mover)0x0,false);
    }
    (this->m_vectorsInfoRight).m_size = size;
  }
  uVar8 = (this->m_vectorComparison).m_size;
  local_a8 = this_02;
  if (uVar8 != size) {
    if (uVar8 <= size) {
      if ((this->m_vectorComparison).m_capacity < size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_vectorComparison,size,uVar8 + 1 == size,1,
                   (object_mover)0x0,false);
        uVar8 = (this->m_vectorComparison).m_size;
      }
      memset((this->m_vectorComparison).m_p + uVar8,0,(ulong)(size - uVar8));
    }
    (this->m_vectorComparison).m_size = size;
  }
  local_a0 = &this->m_nodes;
  uVar16 = (int)local_b0 * 4;
  uVar8 = (this->m_nodes).m_size;
  if (uVar8 != uVar16) {
    if (uVar8 <= uVar16) {
      if ((this->m_nodes).m_capacity < uVar16) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)local_a0,uVar16,uVar8 + 1 == uVar16,0x30,
                   vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover,
                   false);
        uVar8 = (this->m_nodes).m_size;
      }
      if (uVar16 - uVar8 != 0) {
        pvVar9 = local_a0->m_p + uVar8;
        pvVar12 = pvVar9 + (uVar16 - uVar8);
        do {
          *(undefined8 *)(pvVar9->m_centroid).m_s = 0;
          pvVar9->m_total_weight = 0;
          pvVar9->m_left = -1;
          pvVar9->m_right = -1;
          pvVar9->m_codebook_index = -1;
          pvVar9->m_unsplittable = false;
          pvVar9->m_alternative = false;
          pvVar9->m_processed = false;
          pvVar9 = pvVar9 + 1;
        } while (pvVar9 != pvVar12);
      }
    }
    (this->m_nodes).m_size = uVar16;
  }
  peVar6 = local_88;
  pvVar2 = (this->m_codebook).m_p;
  if (pvVar2 != (vec<2U,_float> *)0x0) {
    crnlib_free(pvVar2);
    (this->m_codebook).m_p = (vec<2U,_float> *)0x0;
    (this->m_codebook).m_size = 0;
    (this->m_codebook).m_capacity = 0;
  }
  if (pTask_pool == (task_pool *)0x0) {
    local_b4 = 1;
  }
  else {
    local_b4 = pTask_pool->m_num_threads + 1;
  }
  uVar14 = (ulong)(this->m_vectorsInfo).m_size;
  if (uVar14 == 0) {
    uVar10 = 0;
    fVar20 = 0.0;
    fVar21 = 0.0;
    dVar22 = 0.0;
  }
  else {
    pVVar3 = (VectorInfo *)peVar6->m_p;
    pvVar2 = local_a8->m_p;
    pdVar4 = (double *)local_c0->m_vectors;
    fVar20 = 0.0;
    fVar21 = 0.0;
    dVar22 = 0.0;
    uVar13 = 0;
    uVar10 = 0;
    do {
      pVVar3[uVar13].index = (uint)uVar13;
      uVar8 = weights[uVar13];
      fVar23 = (float)uVar8;
      pVVar3[uVar13].weight = uVar8;
      fVar25 = fVar23 * (float)*(undefined8 *)vectors[uVar13].m_s;
      fVar26 = fVar23 * (float)((ulong)*(undefined8 *)vectors[uVar13].m_s >> 0x20);
      *(ulong *)pvVar2[uVar13].m_s = CONCAT44(fVar26,fVar25);
      fVar20 = fVar20 + fVar25;
      fVar21 = fVar21 + fVar26;
      uVar10 = uVar10 + uVar8;
      dVar24 = (double)((vectors[uVar13].m_s[1] * vectors[uVar13].m_s[1] +
                        vectors[uVar13].m_s[0] * vectors[uVar13].m_s[0]) * fVar23);
      pdVar4[uVar13] = dVar24;
      dVar22 = dVar22 + dVar24;
      uVar13 = uVar13 + 1;
    } while (uVar14 != uVar13);
  }
  local_50._4_4_ =
       (undefined4)(dVar22 - (double)((fVar21 * fVar21 + fVar20 * fVar20) / (float)uVar10));
  fVar23 = 1.0 / (float)uVar10;
  local_78.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c4 = 0;
  pvVar9 = local_a0->m_p;
  *(ulong *)(pvVar9->m_centroid).m_s = CONCAT44(fVar21 * fVar23,fVar20 * fVar23);
  pvVar9->m_total_weight = uVar10;
  pvVar9->m_variance = (float)local_50._4_4_;
  pvVar9->m_begin = 0;
  pvVar9->m_end = size;
  pvVar9->m_left = -1;
  pvVar9->m_right = -1;
  pvVar9->m_codebook_index = -1;
  pvVar9->m_unsplittable = false;
  pvVar9->m_alternative = false;
  pvVar9->m_processed = false;
  local_50._0_4_ = 0;
  local_88 = (elemental_vector *)&this->m_codebook;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
  ::push(&local_78,(value_type *)local_50);
  uVar14 = local_b0;
  local_c4 = local_c4 + 1;
  uVar17 = 1;
  uVar16 = (uint)local_b0;
  uVar8 = uVar17;
  local_c0 = this;
  if (1 < local_b4) {
    uVar10 = (ulong)local_b4;
    if (1 < uVar16) {
      do {
        uVar8 = uVar17;
        if (((long)local_78.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_78.c.
                   super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar10) ||
           (bVar7 = split_node(this,&local_78,&local_c4,pTask_pool), !bVar7)) break;
        uVar17 = uVar17 + 1;
        uVar8 = uVar16;
      } while (uVar16 != uVar17);
    }
    if ((long)local_78.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_78.c.
              super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3 == uVar10) {
      std::
      vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ::vector((vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                *)local_50,&local_78.c);
      uVar16 = local_b4;
      local_a8 = (vector<crnlib::vec<2U,_float>_> *)
                 CONCAT44(local_a8._4_4_,(int)((uVar14 & 0xffffffff) / (ulong)local_b4));
      local_98.m_p = (void *)0x0;
      local_98.m_size = 0;
      local_98.m_capacity = 0;
      elemental_vector::increase_capacity(&local_98,local_b4,false,0xc,(object_mover)0x0,false);
      local_98.m_size = uVar16;
      pNVar11 = (pointer)CONCAT44(local_50._4_4_,local_50._0_4_);
      if (pNVar11 != local_48) {
        iVar15 = (int)local_b0 * 2;
        iVar18 = (int)local_a8 * 2;
        uVar16 = 0;
        do {
          pvVar5 = local_98.m_p;
          uVar14 = (ulong)uVar16;
          *(uint *)((long)local_98.m_p + uVar14 * 0xc) = pNVar11->m_index;
          *(int *)((long)local_98.m_p + uVar14 * 0xc + 4) = iVar15;
          *(int *)((long)local_98.m_p + uVar14 * 0xc + 8) = (int)local_a8;
          pObj = (executable_task *)crnlib_malloc(0x28);
          pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001d2a20;
          pObj[1]._vptr_executable_task = (_func_int **)local_c0;
          pObj[2]._vptr_executable_task = (_func_int **)split_alternative_node_task;
          pObj[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
          task_pool::queue_task(pTask_pool,pObj,uVar14,(void *)(uVar14 * 0xc + (long)pvVar5));
          std::
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
          ::pop((priority_queue<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                 *)local_50);
          iVar15 = iVar15 + iVar18;
          uVar16 = uVar16 + 1;
          pNVar11 = (pointer)CONCAT44(local_50._4_4_,local_50._0_4_);
        } while (pNVar11 != local_48);
      }
      task_pool::join(pTask_pool);
      this = local_c0;
      if (local_98.m_p != (void *)0x0) {
        crnlib_free(local_98.m_p);
      }
      uVar16 = (uint)local_b0;
      if ((void *)CONCAT44(local_50._4_4_,local_50._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_50._4_4_,local_50._0_4_));
      }
    }
  }
  if (uVar8 < uVar16) {
    iVar18 = ~uVar8 + uVar16;
    do {
      bVar7 = split_node(this,&local_78,&local_c4,pTask_pool);
      bVar19 = iVar18 != 0;
      iVar18 = iVar18 + -1;
    } while (bVar7 && bVar19);
  }
  if (local_c4 != 0) {
    this_01 = &local_c0->m_node_index_map;
    uVar14 = 0;
    do {
      pvVar9 = local_a0->m_p;
      if ((pvVar9[uVar14].m_alternative != false) || (pvVar9[uVar14].m_left == -1)) {
        pvVar9 = pvVar9 + uVar14;
        uVar8 = (local_c0->m_codebook).m_size;
        pvVar9->m_codebook_index = uVar8;
        if ((local_c0->m_codebook).m_capacity <= uVar8) {
          elemental_vector::increase_capacity(local_88,uVar8 + 1,true,8,(object_mover)0x0,false);
          uVar8 = (local_c0->m_codebook).m_size;
        }
        *(undefined8 *)(local_c0->m_codebook).m_p[uVar8].m_s =
             *(undefined8 *)(pvVar9->m_centroid).m_s;
        puVar1 = &(local_c0->m_codebook).m_size;
        *puVar1 = *puVar1 + 1;
        if (((char)local_7c != '\0') &&
           (uVar10 = (ulong)pvVar9->m_begin, pvVar9->m_begin < pvVar9->m_end)) {
          do {
            local_98.m_p = *(void **)local_c0->m_vectors
                                     [(local_c0->m_vectorsInfo).m_p[uVar10].index].m_s;
            local_98.m_size = pvVar9->m_codebook_index;
            hash_map<crnlib::vec<2U,_float>,_unsigned_int,_crnlib::hasher<crnlib::vec<2U,_float>_>,_crnlib::equal_to<crnlib::vec<2U,_float>_>_>
            ::insert((insert_result *)local_50,this_01,(vec<2U,_float> *)&local_98,&local_98.m_size)
            ;
            uVar10 = uVar10 + 1;
          } while (uVar10 < pvVar9->m_end);
        }
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_c4);
  }
  if (local_78.c.
      super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.c.
                    super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<2U,_float>_>::NodeInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generate_codebook(VectorType* vectors, uint* weights, uint size, uint max_splits, bool generate_node_index_map = false, task_pool* pTask_pool = 0)
        {
            m_vectors = vectors;
            m_vectorsInfo.resize(size);
            m_weightedVectors.resize(size);
            m_weightedDotProducts.resize(size);
            m_vectorsInfoLeft.resize(size);
            m_vectorsInfoRight.resize(size);
            m_vectorComparison.resize(size);
            m_nodes.resize(max_splits << 2);
            m_codebook.clear();
            uint num_tasks = pTask_pool ? pTask_pool->get_num_threads() + 1 : 1;

            vq_node root;
            root.m_begin = 0;
            root.m_end = size;
            double ttsum = 0.0f;
            for (uint i = 0; i < m_vectorsInfo.size(); i++)
            {
                const VectorType& v = vectors[i];
                m_vectorsInfo[i].index = i;
                const uint weight = m_vectorsInfo[i].weight = weights[i];
                m_weightedVectors[i] = v * (float)weight;
                root.m_centroid += m_weightedVectors[i];
                root.m_total_weight += weight;
                m_weightedDotProducts[i] = v.dot(v) * weight;
                ttsum += m_weightedDotProducts[i];
            }
            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));
            root.m_centroid *= (1.0f / root.m_total_weight);

            std::priority_queue<NodeInfo> node_queue;
            uint begin_node = 0, end_node = begin_node, splits = 0;
            m_nodes[end_node] = root;
            node_queue.push(NodeInfo(end_node, root.m_variance));
            end_node++;
            splits++;

            if (num_tasks > 1)
            {
                while (splits < max_splits && node_queue.size() != num_tasks && split_node(node_queue, end_node, pTask_pool))
                {
                    splits++;
                }
                if (node_queue.size() == num_tasks)
                {
                    std::priority_queue<NodeInfo> alternative_node_queue = node_queue;
                    uint alternative_node = max_splits << 1, alternative_max_splits = max_splits / num_tasks;
                    crnlib::vector<split_alternative_node_task_params> params(num_tasks);
                    for (uint task = 0; !alternative_node_queue.empty(); alternative_node_queue.pop(), alternative_node += alternative_max_splits << 1, task++)
                    {
                        params[task].main_node = alternative_node_queue.top().m_index;
                        params[task].alternative_node = alternative_node;
                        params[task].max_splits = alternative_max_splits;
                        pTask_pool->queue_object_task(this, &tree_clusterizer::split_alternative_node_task, task, &params[task]);
                    }
                    pTask_pool->join();
                }
            }

            while (splits < max_splits && split_node(node_queue, end_node, pTask_pool))
            {
                splits++;
            }

            for (uint i = begin_node; i < end_node; i++)
            {
                vq_node& node = m_nodes[i];
                if (!node.m_alternative && node.m_left != -1)
                {
                    continue;
                }
                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);
                if (generate_node_index_map)
                {
                    for (uint j = node.m_begin; j < node.m_end; j++)
                    {
                        m_node_index_map.insert(std::make_pair(m_vectors[m_vectorsInfo[j].index], node.m_codebook_index));
                    }
                }
            }
        }